

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

Vec_Int_t * Kf_ManCreateFaninCounts(Gia_Man_t *p)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = p->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar4 = iVar5;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar2;
  iVar5 = p->nObjs;
  if ((0 < iVar5) && (pGVar3 = p->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
    lVar6 = 0;
    do {
      uVar1 = *(ulong *)pGVar3;
      iVar5 = 0;
      if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
        iVar5 = 2 - ((uint)(((undefined1  [12])pGVar3[-(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)]
                            & (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff) +
                    (uint)(((undefined1  [12])pGVar3[-(uVar1 & 0x1fffffff)] &
                           (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff));
      }
      Vec_IntPush(p_00,iVar5);
      lVar6 = lVar6 + 1;
      iVar5 = p->nObjs;
    } while ((lVar6 < iVar5) && (pGVar3 = p->pObjs + lVar6, p->pObjs != (Gia_Obj_t *)0x0));
  }
  if (p_00->nSize == iVar5) {
    return p_00;
  }
  __assert_fail("Vec_IntSize(vCounts) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                ,0x3ea,"Vec_Int_t *Kf_ManCreateFaninCounts(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Kf_ManCreateFaninCounts( Gia_Man_t * p )  
{
    Vec_Int_t * vCounts;
    Gia_Obj_t * pObj; int i;
    vCounts = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_IntPush( vCounts, 2 - Gia_ObjIsCi(Gia_ObjFanin0(pObj)) - Gia_ObjIsCi(Gia_ObjFanin1(pObj)) );
        else
            Vec_IntPush( vCounts, 0 );
    }
    assert( Vec_IntSize(vCounts) == Gia_ManObjNum(p) );
    return vCounts;
}